

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locgen.cpp
# Opt level: O0

void top_amount_widget_set_proc(Am_Object *cmd)

{
  int iVar1;
  Am_Value *pAVar2;
  ostream *poVar3;
  void *this;
  Am_Object local_48;
  int local_3c;
  Am_Ptr pvStack_38;
  int top_control;
  am_loc_values *loc_values;
  int new_val;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object win;
  Am_Object *cmd_local;
  
  win.data = (Am_Object_Data *)cmd;
  Am_Object::Get_Object(&local_20,(Am_Slot_Key)cmd,0x170);
  Am_Object::Get_Owner(&local_18,(Am_Slot_Flags)&local_20);
  Am_Object::~Am_Object(&local_20);
  pAVar2 = Am_Object::Get(cmd,0x169,0);
  loc_values._0_4_ = Am_Value::operator_cast_to_int(pAVar2);
  pAVar2 = Am_Object::Get(&local_18,0xfa,0);
  pvStack_38 = Am_Value::operator_cast_to_void_(pAVar2);
  Am_Object::Get_Object(&local_48,(Am_Slot_Key)&local_18,(ulong)Am_TOP_HOW);
  pAVar2 = Am_Object::Get(&local_48,0x169,0);
  iVar1 = Am_Value::operator_cast_to_int(pAVar2);
  Am_Object::~Am_Object(&local_48);
  local_3c = iVar1;
  if (iVar1 == 10) {
    *(int *)((long)pvStack_38 + 0x20) = (int)loc_values;
  }
  else if (iVar1 == 0xb) {
    *(int *)((long)pvStack_38 + 0x24) = (int)loc_values;
  }
  else if (iVar1 == 0xe) {
    *(int *)((long)pvStack_38 + 0x2c) = (int)loc_values;
  }
  else if (iVar1 - 0x11U < 4) {
    *(int *)((long)pvStack_38 + 0x28) = (int)loc_values;
  }
  else if ((iVar1 != 0x65) && (iVar1 != 0x66)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar3 = std::operator<<(poVar3,"Bad type for top control ");
    this = (void *)std::ostream::operator<<(poVar3,local_3c);
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  Am_Object::~Am_Object(&local_18);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, top_amount_widget_set, (Am_Object cmd))
{
  Am_Object win = cmd.Get_Object(Am_SAVED_OLD_OWNER).Get_Owner();
  int new_val = cmd.Get(Am_VALUE);
  am_loc_values *loc_values = (am_loc_values *)(Am_Ptr)win.Get(Am_VALUES);
  int top_control = win.Get_Object(Am_TOP_HOW).Get(Am_VALUE);
  switch (top_control) {
  case am_change_equals:
    loc_values->top_equals = new_val;
    break;
  case am_change_offset:
    loc_values->top_offset = new_val;
    break;
  case am_ask_user_generalize:
    break; //shouldn't happen
  case am_ask_user_type:
    break; //shouldn't happen
  case am_change_offset_centered:
    loc_values->top_centered = new_val;
    break;
  case am_change_offset_top_outside:
  case am_change_offset_top_inside:
  case am_change_offset_bottom_inside:
  case am_change_offset_bottom_outside:
    loc_values->top_object_offset = new_val;
    break;
  default:
    Am_ERROR("Bad type for top control " << top_control);
  } //end switch
}